

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O1

void secp256k1_gej_add_var(secp256k1_gej *r,secp256k1_gej *a,secp256k1_gej *b,secp256k1_fe *rzr)

{
  secp256k1_fe *psVar1;
  secp256k1_fe *a_00;
  uint64_t *puVar2;
  secp256k1_fe *psVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  secp256k1_gej *psVar12;
  ulong uVar13;
  secp256k1_gej *a_01;
  ulong uVar14;
  ulong uVar15;
  secp256k1_fe h3;
  secp256k1_fe s1;
  secp256k1_fe u2;
  secp256k1_fe u1;
  secp256k1_fe z22;
  secp256k1_fe s2;
  secp256k1_fe z12;
  undefined1 local_248 [56];
  uint64_t uStack_210;
  uint64_t local_208;
  uint64_t uStack_200;
  ulong local_1f8;
  ulong local_1f0;
  secp256k1_fe local_1e8;
  undefined1 local_1b8 [56];
  uint64_t uStack_180;
  uint64_t local_178;
  uint64_t uStack_170;
  uint64_t local_168;
  int local_160;
  int local_15c;
  undefined1 local_158 [152];
  long lStack_c0;
  long local_b8;
  long lStack_b0;
  long local_a8;
  secp256k1_fe local_98;
  secp256k1_fe local_68;
  
  secp256k1_gej_verify(a);
  secp256k1_gej_verify(b);
  psVar12 = b;
  if ((a->infinity != 0) || (psVar12 = a, b->infinity != 0)) {
    memcpy(r,psVar12,0x98);
    return;
  }
  psVar1 = &b->z;
  secp256k1_fe_sqr((secp256k1_fe *)(local_158 + 0x60),psVar1);
  a_00 = &a->z;
  secp256k1_fe_sqr(&local_98,a_00);
  secp256k1_fe_mul((secp256k1_fe *)(local_158 + 0x30),&a->x,(secp256k1_fe *)(local_158 + 0x60));
  secp256k1_fe_mul((secp256k1_fe *)local_158,&b->x,&local_98);
  secp256k1_fe_mul((secp256k1_fe *)local_1b8,&a->y,(secp256k1_fe *)(local_158 + 0x60));
  secp256k1_fe_mul((secp256k1_fe *)local_1b8,(secp256k1_fe *)local_1b8,psVar1);
  psVar3 = (secp256k1_fe *)(local_158 + 0x90);
  secp256k1_fe_mul(psVar3,&b->y,&local_98);
  secp256k1_fe_mul(psVar3,psVar3,a_00);
  secp256k1_fe_verify((secp256k1_fe *)(local_158 + 0x30));
  psVar12 = (secp256k1_gej *)0x1;
  secp256k1_fe_verify_magnitude((secp256k1_fe *)(local_158 + 0x30),1);
  local_1e8.n[0] = 0x3ffffbfffff0bc - local_158._48_8_;
  local_1e8.n[1] = 0x3ffffffffffffc - local_158._56_8_;
  local_1e8.n[2] = 0x3ffffffffffffc - local_158._64_8_;
  local_1e8.n[3] = 0x3ffffffffffffc - local_158._72_8_;
  local_1e8.n[4] = 0x3fffffffffffc - local_158._80_8_;
  local_1e8.magnitude = 2;
  local_1e8.normalized = 0;
  secp256k1_fe_verify(&local_1e8);
  secp256k1_fe_verify(&local_1e8);
  a_01 = (secp256k1_gej *)local_158;
  secp256k1_fe_verify((secp256k1_fe *)a_01);
  if (local_158._40_4_ + local_1e8.magnitude < 0x21) {
    local_1e8.n[0] = local_1e8.n[0] + local_158._0_8_;
    local_1e8.n[1] = local_1e8.n[1] + local_158._8_8_;
    local_1e8.n[2] = local_1e8.n[2] + local_158._16_8_;
    local_1e8.n[3] = local_1e8.n[3] + local_158._24_8_;
    local_1e8.n[4] = local_1e8.n[4] + local_158._32_8_;
    local_1e8.normalized = 0;
    local_1e8.magnitude = local_158._40_4_ + local_1e8.magnitude;
    secp256k1_fe_verify(&local_1e8);
    secp256k1_fe_verify((secp256k1_fe *)(local_158 + 0x90));
    psVar12 = (secp256k1_gej *)0x1;
    secp256k1_fe_verify_magnitude((secp256k1_fe *)(local_158 + 0x90),1);
    local_248._48_8_ = 0x3ffffbfffff0bc - local_158._144_8_;
    uStack_210 = 0x3ffffffffffffc - lStack_c0;
    local_208 = 0x3ffffffffffffc - local_b8;
    uStack_200 = 0x3ffffffffffffc - lStack_b0;
    local_1f8 = 0x3fffffffffffc - local_a8;
    local_1f0 = 2;
    secp256k1_fe_verify((secp256k1_fe *)(local_248 + 0x30));
    secp256k1_fe_verify((secp256k1_fe *)(local_248 + 0x30));
    a_01 = (secp256k1_gej *)local_1b8;
    secp256k1_fe_verify((secp256k1_fe *)a_01);
    if (0x20 < local_1b8._40_4_ + (int)local_1f0) goto LAB_0011d181;
    local_248._48_8_ = local_248._48_8_ + local_1b8._0_8_;
    uStack_210 = uStack_210 + local_1b8._8_8_;
    local_208 = local_208 + local_1b8._16_8_;
    uStack_200 = uStack_200 + local_1b8._24_8_;
    local_1f8 = local_1f8 + local_1b8._32_8_;
    local_1f0 = (ulong)(uint)(local_1b8._40_4_ + (int)local_1f0);
    secp256k1_fe_verify((secp256k1_fe *)(local_248 + 0x30));
    secp256k1_fe_verify(&local_1e8);
    uVar10 = (local_1e8.n[4] >> 0x30) * 0x1000003d1 + local_1e8.n[0];
    if (((uVar10 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar10 & 0xfffffffffffff) == 0)) {
      uVar11 = (uVar10 >> 0x34) + local_1e8.n[1];
      uVar13 = (uVar11 >> 0x34) + local_1e8.n[2];
      uVar14 = (uVar13 >> 0x34) + local_1e8.n[3];
      uVar15 = (uVar14 >> 0x34) + (local_1e8.n[4] & 0xffffffffffff);
      if ((((uVar11 | uVar10 | uVar13 | uVar14) & 0xfffffffffffff) == 0 && uVar15 == 0) ||
         (((uVar10 | 0x1000003d0) & uVar11 & uVar13 & uVar14 & (uVar15 ^ 0xf000000000000)) ==
          0xfffffffffffff)) {
        secp256k1_fe_verify((secp256k1_fe *)(local_248 + 0x30));
        uVar10 = (local_1f8 >> 0x30) * 0x1000003d1 + local_248._48_8_;
        if (((uVar10 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar10 & 0xfffffffffffff) == 0)) {
          uVar11 = (uVar10 >> 0x34) + uStack_210;
          uVar13 = (uVar11 >> 0x34) + local_208;
          uVar14 = (uVar13 >> 0x34) + uStack_200;
          uVar15 = (uVar14 >> 0x34) + (local_1f8 & 0xffffffffffff);
          if ((((uVar11 | uVar10 | uVar13 | uVar14) & 0xfffffffffffff) == 0 && uVar15 == 0) ||
             (((uVar10 | 0x1000003d0) & uVar11 & uVar13 & uVar14 & (uVar15 ^ 0xf000000000000)) ==
              0xfffffffffffff)) {
            secp256k1_gej_double_var(r,a,(secp256k1_fe *)0x0);
            return;
          }
        }
        secp256k1_gej_set_infinity(r);
        return;
      }
    }
    r->infinity = 0;
    psVar3 = (secp256k1_fe *)(local_1b8 + 0x30);
    secp256k1_fe_mul(psVar3,&local_1e8,psVar1);
    secp256k1_fe_mul(&r->z,a_00,psVar3);
    secp256k1_fe_sqr(&local_68,&local_1e8);
    secp256k1_fe_verify(&local_68);
    secp256k1_fe_verify_magnitude(&local_68,1);
    local_68.n[0] = 0x3ffffbfffff0bc - local_68.n[0];
    local_68.n[1] = 0x3ffffffffffffc - local_68.n[1];
    local_68.n[2] = 0x3ffffffffffffc - local_68.n[2];
    local_68.n[3] = 0x3ffffffffffffc - local_68.n[3];
    local_68.n[4] = 0x3fffffffffffc - local_68.n[4];
    local_68.magnitude = 2;
    local_68.normalized = 0;
    secp256k1_fe_verify(&local_68);
    a_01 = (secp256k1_gej *)local_248;
    secp256k1_fe_mul((secp256k1_fe *)a_01,&local_68,&local_1e8);
    secp256k1_fe_mul(psVar3,(secp256k1_fe *)(local_158 + 0x30),&local_68);
    psVar12 = (secp256k1_gej *)(local_248 + 0x30);
    secp256k1_fe_sqr(&r->x,(secp256k1_fe *)psVar12);
    secp256k1_fe_verify(&r->x);
    secp256k1_fe_verify((secp256k1_fe *)a_01);
    iVar9 = local_248._40_4_ + (r->x).magnitude;
    if (0x20 < iVar9) goto LAB_0011d186;
    uVar4 = (r->x).n[1];
    uVar5 = (r->x).n[2];
    uVar6 = (r->x).n[3];
    (r->x).n[0] = (r->x).n[0] + local_248._0_8_;
    (r->x).n[1] = uVar4 + local_248._8_8_;
    (r->x).n[2] = uVar5 + local_248._16_8_;
    (r->x).n[3] = uVar6 + local_248._24_8_;
    puVar2 = (r->x).n + 4;
    *puVar2 = *puVar2 + local_248._32_8_;
    (r->x).magnitude = iVar9;
    (r->x).normalized = 0;
    secp256k1_fe_verify(&r->x);
    secp256k1_fe_verify(&r->x);
    a_01 = (secp256k1_gej *)(local_1b8 + 0x30);
    secp256k1_fe_verify((secp256k1_fe *)a_01);
    iVar9 = local_160 + (r->x).magnitude;
    if (0x20 < iVar9) goto LAB_0011d18b;
    uVar4 = (r->x).n[1];
    uVar5 = (r->x).n[2];
    uVar6 = (r->x).n[3];
    a_01 = (secp256k1_gej *)(local_1b8 + 0x30);
    (r->x).n[0] = (r->x).n[0] + local_1b8._48_8_;
    (r->x).n[1] = uVar4 + uStack_180;
    (r->x).n[2] = uVar5 + local_178;
    (r->x).n[3] = uVar6 + uStack_170;
    puVar2 = (r->x).n + 4;
    *puVar2 = *puVar2 + local_168;
    (r->x).magnitude = iVar9;
    (r->x).normalized = 0;
    secp256k1_fe_verify(&r->x);
    secp256k1_fe_verify(&r->x);
    secp256k1_fe_verify((secp256k1_fe *)a_01);
    iVar9 = local_160 + (r->x).magnitude;
    if (0x20 < iVar9) goto LAB_0011d190;
    uVar4 = (r->x).n[1];
    uVar5 = (r->x).n[2];
    uVar6 = (r->x).n[3];
    (r->x).n[0] = (r->x).n[0] + local_1b8._48_8_;
    (r->x).n[1] = uVar4 + uStack_180;
    (r->x).n[2] = uVar5 + local_178;
    (r->x).n[3] = uVar6 + uStack_170;
    puVar2 = (r->x).n + 4;
    *puVar2 = *puVar2 + local_168;
    (r->x).magnitude = iVar9;
    (r->x).normalized = 0;
    secp256k1_fe_verify(&r->x);
    secp256k1_fe_verify((secp256k1_fe *)(local_1b8 + 0x30));
    a_01 = r;
    secp256k1_fe_verify(&r->x);
    iVar9 = (r->x).magnitude + local_160;
    if (iVar9 < 0x21) {
      local_1b8._48_8_ = (r->x).n[0] + local_1b8._48_8_;
      uStack_180 = (r->x).n[1] + uStack_180;
      local_178 = (r->x).n[2] + local_178;
      uStack_170 = (r->x).n[3] + uStack_170;
      local_168 = local_168 + (r->x).n[4];
      local_15c = 0;
      local_160 = iVar9;
      secp256k1_fe_verify((secp256k1_fe *)(local_1b8 + 0x30));
      psVar1 = &r->y;
      secp256k1_fe_mul(psVar1,(secp256k1_fe *)(local_1b8 + 0x30),(secp256k1_fe *)(local_248 + 0x30))
      ;
      a_01 = (secp256k1_gej *)local_248;
      psVar12 = a_01;
      secp256k1_fe_mul((secp256k1_fe *)a_01,(secp256k1_fe *)a_01,(secp256k1_fe *)local_1b8);
      secp256k1_fe_verify(psVar1);
      secp256k1_fe_verify((secp256k1_fe *)a_01);
      iVar9 = local_248._40_4_ + (r->y).magnitude;
      if (iVar9 < 0x21) {
        uVar4 = (r->y).n[1];
        uVar5 = (r->y).n[2];
        uVar6 = (r->y).n[3];
        (r->y).n[0] = (r->y).n[0] + local_248._0_8_;
        (r->y).n[1] = uVar4 + local_248._8_8_;
        (r->y).n[2] = uVar5 + local_248._16_8_;
        (r->y).n[3] = uVar6 + local_248._24_8_;
        puVar2 = (r->y).n + 4;
        *puVar2 = *puVar2 + local_248._32_8_;
        (r->y).magnitude = iVar9;
        (r->y).normalized = 0;
        secp256k1_fe_verify(psVar1);
        secp256k1_gej_verify(r);
        return;
      }
      goto LAB_0011d19a;
    }
  }
  else {
    secp256k1_gej_add_var_cold_7();
LAB_0011d181:
    secp256k1_gej_add_var_cold_6();
LAB_0011d186:
    secp256k1_gej_add_var_cold_5();
LAB_0011d18b:
    secp256k1_gej_add_var_cold_4();
LAB_0011d190:
    secp256k1_gej_add_var_cold_3();
  }
  secp256k1_gej_add_var_cold_2();
LAB_0011d19a:
  secp256k1_gej_add_var_cold_1();
  secp256k1_gej_verify(psVar12);
  a_01->infinity = psVar12->infinity;
  uVar4 = (psVar12->x).n[0];
  uVar5 = (psVar12->x).n[1];
  uVar6 = (psVar12->x).n[2];
  uVar7 = (psVar12->x).n[3];
  iVar9 = (psVar12->x).magnitude;
  iVar8 = (psVar12->x).normalized;
  (a_01->x).n[4] = (psVar12->x).n[4];
  (a_01->x).magnitude = iVar9;
  (a_01->x).normalized = iVar8;
  (a_01->x).n[2] = uVar6;
  (a_01->x).n[3] = uVar7;
  (a_01->x).n[0] = uVar4;
  (a_01->x).n[1] = uVar5;
  psVar1 = &a_01->y;
  uVar4 = (psVar12->y).n[1];
  uVar5 = (psVar12->y).n[2];
  uVar6 = (psVar12->y).n[3];
  uVar7 = (psVar12->y).n[4];
  iVar9 = (psVar12->y).magnitude;
  iVar8 = (psVar12->y).normalized;
  (a_01->y).n[0] = (psVar12->y).n[0];
  (a_01->y).n[1] = uVar4;
  (a_01->y).n[2] = uVar5;
  (a_01->y).n[3] = uVar6;
  (a_01->y).n[4] = uVar7;
  (a_01->y).magnitude = iVar9;
  (a_01->y).normalized = iVar8;
  uVar4 = (psVar12->z).n[1];
  uVar5 = (psVar12->z).n[2];
  uVar6 = (psVar12->z).n[3];
  uVar7 = (psVar12->z).n[4];
  iVar9 = (psVar12->z).magnitude;
  iVar8 = (psVar12->z).normalized;
  (a_01->z).n[0] = (psVar12->z).n[0];
  (a_01->z).n[1] = uVar4;
  (a_01->z).n[2] = uVar5;
  (a_01->z).n[3] = uVar6;
  (a_01->z).n[4] = uVar7;
  (a_01->z).magnitude = iVar9;
  (a_01->z).normalized = iVar8;
  secp256k1_fe_verify(psVar1);
  uVar10 = (a_01->y).n[4];
  uVar13 = (uVar10 >> 0x30) * 0x1000003d1 + (a_01->y).n[0];
  uVar11 = (uVar13 >> 0x34) + (a_01->y).n[1];
  uVar14 = (uVar11 >> 0x34) + (a_01->y).n[2];
  uVar15 = (uVar14 >> 0x34) + (a_01->y).n[3];
  (a_01->y).n[0] = uVar13 & 0xfffffffffffff;
  (a_01->y).n[1] = uVar11 & 0xfffffffffffff;
  (a_01->y).n[2] = uVar14 & 0xfffffffffffff;
  (a_01->y).n[3] = uVar15 & 0xfffffffffffff;
  (a_01->y).n[4] = (uVar15 >> 0x34) + (uVar10 & 0xffffffffffff);
  (a_01->y).magnitude = 1;
  secp256k1_fe_verify(psVar1);
  secp256k1_fe_verify(psVar1);
  secp256k1_fe_verify_magnitude(psVar1,1);
  uVar4 = (a_01->y).n[1];
  uVar5 = (a_01->y).n[2];
  uVar6 = (a_01->y).n[3];
  (a_01->y).n[0] = 0x3ffffbfffff0bc - (a_01->y).n[0];
  (a_01->y).n[1] = 0x3ffffffffffffc - uVar4;
  (a_01->y).n[2] = 0x3ffffffffffffc - uVar5;
  (a_01->y).n[3] = 0x3ffffffffffffc - uVar6;
  (a_01->y).n[4] = 0x3fffffffffffc - (a_01->y).n[4];
  (a_01->y).magnitude = 2;
  (a_01->y).normalized = 0;
  secp256k1_fe_verify(psVar1);
  secp256k1_gej_verify(a_01);
  return;
}

Assistant:

static void secp256k1_gej_add_var(secp256k1_gej *r, const secp256k1_gej *a, const secp256k1_gej *b, secp256k1_fe *rzr) {
    /* 12 mul, 4 sqr, 11 add/negate/normalizes_to_zero (ignoring special cases) */
    secp256k1_fe z22, z12, u1, u2, s1, s2, h, i, h2, h3, t;
    SECP256K1_GEJ_VERIFY(a);
    SECP256K1_GEJ_VERIFY(b);

    if (a->infinity) {
        VERIFY_CHECK(rzr == NULL);
        *r = *b;
        return;
    }
    if (b->infinity) {
        if (rzr != NULL) {
            secp256k1_fe_set_int(rzr, 1);
        }
        *r = *a;
        return;
    }

    secp256k1_fe_sqr(&z22, &b->z);
    secp256k1_fe_sqr(&z12, &a->z);
    secp256k1_fe_mul(&u1, &a->x, &z22);
    secp256k1_fe_mul(&u2, &b->x, &z12);
    secp256k1_fe_mul(&s1, &a->y, &z22); secp256k1_fe_mul(&s1, &s1, &b->z);
    secp256k1_fe_mul(&s2, &b->y, &z12); secp256k1_fe_mul(&s2, &s2, &a->z);
    secp256k1_fe_negate(&h, &u1, 1); secp256k1_fe_add(&h, &u2);
    secp256k1_fe_negate(&i, &s2, 1); secp256k1_fe_add(&i, &s1);
    if (secp256k1_fe_normalizes_to_zero_var(&h)) {
        if (secp256k1_fe_normalizes_to_zero_var(&i)) {
            secp256k1_gej_double_var(r, a, rzr);
        } else {
            if (rzr != NULL) {
                secp256k1_fe_set_int(rzr, 0);
            }
            secp256k1_gej_set_infinity(r);
        }
        return;
    }

    r->infinity = 0;
    secp256k1_fe_mul(&t, &h, &b->z);
    if (rzr != NULL) {
        *rzr = t;
    }
    secp256k1_fe_mul(&r->z, &a->z, &t);

    secp256k1_fe_sqr(&h2, &h);
    secp256k1_fe_negate(&h2, &h2, 1);
    secp256k1_fe_mul(&h3, &h2, &h);
    secp256k1_fe_mul(&t, &u1, &h2);

    secp256k1_fe_sqr(&r->x, &i);
    secp256k1_fe_add(&r->x, &h3);
    secp256k1_fe_add(&r->x, &t);
    secp256k1_fe_add(&r->x, &t);

    secp256k1_fe_add(&t, &r->x);
    secp256k1_fe_mul(&r->y, &t, &i);
    secp256k1_fe_mul(&h3, &h3, &s1);
    secp256k1_fe_add(&r->y, &h3);

    SECP256K1_GEJ_VERIFY(r);
}